

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O0

void __thiscall nuraft::buffer::put(buffer *this,ulong val)

{
  size_t sVar1;
  size_t sVar2;
  overflow_error *this_00;
  byte *pbVar3;
  ulong in_RSI;
  buffer *in_RDI;
  size_t i;
  byte *d;
  ulong local_30;
  
  sVar1 = size(in_RDI);
  sVar2 = pos(in_RDI);
  if (sVar1 - sVar2 < 8) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_00,"insufficient buffer to store unsigned long");
    __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  pbVar3 = data(in_RDI);
  for (local_30 = 0; local_30 < 8; local_30 = local_30 + 1) {
    pbVar3[local_30] = (byte)(in_RSI >> ((byte)(local_30 << 3) & 0x3f));
  }
  if ((*(uint *)in_RDI & 0x80000000) == 0) {
    *(short *)(in_RDI + 2) = *(short *)(in_RDI + 2) + 8;
  }
  else {
    *(int *)(in_RDI + 4) = *(int *)(in_RDI + 4) + 8;
  }
  return;
}

Assistant:

void buffer::put(ulong val) {
    if (size() - pos() < sz_ulong) {
        throw std::overflow_error("insufficient buffer to store unsigned long");
    }

    byte* d = data();
    for (size_t i = 0; i < sz_ulong; ++i) {
        *(d + i) = (byte)(val >> (i * 8));
    }

    __mv_fw_block(this, sz_ulong);
}